

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

pqpair chisq_s2pq(double xx,double dof)

{
  pqpair pVar1;
  double local_58;
  double bound;
  double df;
  double x;
  double q;
  double p;
  int status;
  int which;
  double dof_local;
  double xx_local;
  pqpair pq;
  
  xx_local = 0.0;
  pq.p = 1.0;
  p._4_4_ = 1;
  q = 0.0;
  x = 1.0;
  if ((0.0 < xx) && (0.0 < dof)) {
    bound = dof;
    df = xx;
    _status = dof;
    dof_local = xx;
    cdfchi((int *)((long)&p + 4),&q,&x,&df,&bound,(int *)&p,&local_58);
    xx_local = q;
    pq.p = x;
  }
  pVar1.q = pq.p;
  pVar1.p = xx_local;
  return pVar1;
}

Assistant:

static pqpair chisq_s2pq( double xx , double dof )
{
   int which , status ;
   double p,q,x,df,bound ;
   pqpair pq={0.0,1.0} ;

   which  = 1 ;
   p      = 0.0 ;
   q      = 1.0 ;
   x      = xx ;  if(   x <= 0.0 ) return pq ;
   df     = dof ; if( dof <= 0.0 ) return pq ;

   cdfchi( &which , &p , &q , &x , &df , &status , &bound ) ;
   pq.p = p ; pq.q = q ; return pq ;
}